

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void * startThread(void *obj)

{
  ThreadData::runInThread((ThreadData *)obj);
  if (*(long **)((long)obj + 0x20) != (long *)((long)obj + 0x30)) {
    operator_delete(*(long **)((long)obj + 0x20),*(long *)((long)obj + 0x30) + 1);
  }
  if (*(code **)((long)obj + 0x10) != (code *)0x0) {
    (**(code **)((long)obj + 0x10))(obj,obj,3);
  }
  operator_delete(obj,0x50);
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj){
    ThreadData* data = static_cast<ThreadData*>(obj);
    data->runInThread();
    delete data;
    return nullptr;
}